

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

TaskDatabase * AI::setupTasks(void)

{
  TaskDatabase *in_RDI;
  Task local_1870;
  Task local_14f8;
  Task local_1180;
  Task local_e08;
  Task local_a90;
  Task local_718;
  Task local_390;
  undefined1 local_11;
  TaskDatabase *tasks;
  
  local_11 = 0;
  TaskDatabase::TaskDatabase(in_RDI);
  create_Browse();
  TaskDatabase::addTask(in_RDI,Browse,&local_390);
  Task::~Task(&local_390);
  create_Wander();
  TaskDatabase::addTask(in_RDI,Wander,&local_718);
  Task::~Task(&local_718);
  create_Chase(&local_a90,in_RDI);
  TaskDatabase::addTask(in_RDI,Chase,&local_a90);
  Task::~Task(&local_a90);
  create_Bother();
  TaskDatabase::addTask(in_RDI,Bother,&local_e08);
  Task::~Task(&local_e08);
  create_FaceSound();
  TaskDatabase::addTask(in_RDI,FaceSound,&local_1180);
  Task::~Task(&local_1180);
  create_InvestigateSound();
  TaskDatabase::addTask(in_RDI,InvestigateSound,&local_14f8);
  Task::~Task(&local_14f8);
  create_Null();
  TaskDatabase::addTask(in_RDI,Null,&local_1870);
  Task::~Task(&local_1870);
  setupPredicates(in_RDI);
  return in_RDI;
}

Assistant:

TaskDatabase setupTasks()
	{
		TaskDatabase tasks;
		
		tasks.addTask(TaskIdentifier::Browse, create_Browse());
		tasks.addTask(TaskIdentifier::Wander, create_Wander());
		tasks.addTask(TaskIdentifier::Chase, create_Chase(tasks));
		//tasks.addTask(TaskIdentifier::Search, create_Search());
		//tasks.addTask(TaskIdentifier::Stare, create_Stare());
		tasks.addTask(TaskIdentifier::Bother, create_Bother());
		tasks.addTask(TaskIdentifier::FaceSound, create_FaceSound());
		tasks.addTask(TaskIdentifier::InvestigateSound, create_InvestigateSound());
		/*tasks.addTask(TaskIdentifier::FollowPath, create_FollowPath());
		tasks.addTask(TaskIdentifier::FindSeat, create_FindSeat(tasks));
		tasks.addTask(TaskIdentifier::Relax, create_Relax());
		tasks.addTask(TaskIdentifier::React_Dismiss, create_React_Dismiss());
		tasks.addTask(TaskIdentifier::React_FoundPlayer, create_React_FoundPlayer());
		tasks.addTask(TaskIdentifier::React_LostPlayer, create_React_LostPlayer());
		tasks.addTask(TaskIdentifier::React_Sight, create_React_Sight());
		tasks.addTask(TaskIdentifier::React_Sound, create_React_Sound());
		tasks.addTask(TaskIdentifier::TrackHead, create_TrackHead());*/
		tasks.addTask(TaskIdentifier::Null, create_Null());

		//copyConsiderations(availableUTasks, tasks);
		
		setupPredicates(tasks);

		return tasks;

	}